

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O0

idx_t duckdb::TernaryExecutor::
      SelectLoop<unsigned_int,_unsigned_int,_unsigned_int,_duckdb::UpperInclusiveBetweenOperator,_true,_false,_true>
                (uint *adata,uint *bdata,uint *cdata,SelectionVector *result_sel,idx_t count,
                SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  bool bVar1;
  SelectionVector *this;
  idx_t idx;
  SelectionVector *in_RCX;
  ulong in_R8;
  SelectionVector *in_R9;
  SelectionVector *in_stack_00000008;
  bool comparison_result;
  idx_t cidx;
  idx_t bidx;
  idx_t aidx;
  idx_t result_idx;
  idx_t i;
  idx_t false_count;
  idx_t true_count;
  uint in_stack_ffffffffffffff8c;
  uint in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  undefined8 local_48;
  undefined8 local_40;
  
  local_40 = 0;
  for (local_48 = 0; local_48 < in_R8; local_48 = local_48 + 1) {
    SelectionVector::get_index(in_RCX,local_48);
    SelectionVector::get_index(in_R9,local_48);
    this = (SelectionVector *)SelectionVector::get_index(in_stack_00000008,local_48);
    idx = SelectionVector::get_index((SelectionVector *)cidx,local_48);
    bVar1 = UpperInclusiveBetweenOperator::Operation<unsigned_int>
                      (in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c
                      );
    in_stack_ffffffffffffff94 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff94);
    SelectionVector::set_index
              (this,idx,CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    local_40 = (ulong)(((byte)(in_stack_ffffffffffffff94 >> 0x18) ^ 0xff) & 1) + local_40;
  }
  return in_R8 - local_40;
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}